

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MediaManager.cpp
# Opt level: O0

IDisk * __thiscall Disk::CreateDisk(Disk *this,ILoadingProgress *loading_progress,ILog *log)

{
  pointer *this_00;
  pointer pSVar1;
  bool bVar2;
  int iVar3;
  reference pvVar4;
  vector<FormatType::TrackItem,_std::allocator<FormatType::TrackItem>_> local_d0;
  undefined1 local_a8 [8];
  TrackItem item;
  SingleElements *list_element;
  iterator __end1;
  iterator __begin1;
  vector<SingleElements,_std::allocator<SingleElements>_> *__range1;
  vector<FormatType::TrackItem,_std::allocator<FormatType::TrackItem>_> list_item;
  vector<SingleElements,_std::allocator<SingleElements>_> list_elements;
  IDisk *disk;
  ILog *log_local;
  ILoadingProgress *loading_progress_local;
  Disk *this_local;
  
  list_elements.super__Vector_base<SingleElements,_std::allocator<SingleElements>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (*this->contained_element_->_vptr_IContainedElement[4])
            (&list_item.
              super__Vector_base<FormatType::TrackItem,_std::allocator<FormatType::TrackItem>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,this->contained_element_,3);
  std::vector<FormatType::TrackItem,_std::allocator<FormatType::TrackItem>_>::vector
            ((vector<FormatType::TrackItem,_std::allocator<FormatType::TrackItem>_> *)&__range1);
  this_00 = &list_item.
             super__Vector_base<FormatType::TrackItem,_std::allocator<FormatType::TrackItem>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
  __end1 = std::vector<SingleElements,_std::allocator<SingleElements>_>::begin
                     ((vector<SingleElements,_std::allocator<SingleElements>_> *)this_00);
  list_element = (SingleElements *)
                 std::vector<SingleElements,_std::allocator<SingleElements>_>::end
                           ((vector<SingleElements,_std::allocator<SingleElements>_> *)this_00);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<SingleElements_*,_std::vector<SingleElements,_std::allocator<SingleElements>_>_>
                                *)&list_element);
    if (!bVar2) break;
    item.path.field_2._8_8_ =
         __gnu_cxx::
         __normal_iterator<SingleElements_*,_std::vector<SingleElements,_std::allocator<SingleElements>_>_>
         ::operator*(&__end1);
    FormatType::anon_struct_48_3_9b7c536b::TrackItem((anon_struct_48_3_9b7c536b *)local_a8);
    local_a8 = *(undefined1 (*) [8])(item.path.field_2._8_8_ + 8);
    item.buffer = (uchar *)(long)*(int *)(item.path.field_2._8_8_ + 0x10);
    std::__cxx11::string::operator=((string *)&item.size,*(char **)item.path.field_2._8_8_);
    std::vector<FormatType::TrackItem,_std::allocator<FormatType::TrackItem>_>::push_back
              ((vector<FormatType::TrackItem,_std::allocator<FormatType::TrackItem>_> *)&__range1,
               (value_type *)local_a8);
    FormatType::anon_struct_48_3_9b7c536b::~TrackItem((anon_struct_48_3_9b7c536b *)local_a8);
    __gnu_cxx::
    __normal_iterator<SingleElements_*,_std::vector<SingleElements,_std::allocator<SingleElements>_>_>
    ::operator++(&__end1);
  }
  std::vector<FormatType::TrackItem,_std::allocator<FormatType::TrackItem>_>::vector
            (&local_d0,
             (vector<FormatType::TrackItem,_std::allocator<FormatType::TrackItem>_> *)&__range1);
  iVar3 = DiskBuilder::LoadDisk
                    (&this->disk_builder_,&local_d0,
                     (IDisk **)
                     &list_elements.
                      super__Vector_base<SingleElements,_std::allocator<SingleElements>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,loading_progress);
  std::vector<FormatType::TrackItem,_std::allocator<FormatType::TrackItem>_>::~vector(&local_d0);
  pSVar1 = list_elements.super__Vector_base<SingleElements,_std::allocator<SingleElements>_>._M_impl
           .super__Vector_impl_data._M_end_of_storage;
  if (iVar3 == 0) {
    pvVar4 = std::vector<SingleElements,_std::allocator<SingleElements>_>::operator[]
                       ((vector<SingleElements,_std::allocator<SingleElements>_> *)
                        &list_item.
                         super__Vector_base<FormatType::TrackItem,_std::allocator<FormatType::TrackItem>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
    IDisk::SetName((IDisk *)pSVar1,pvVar4->filename_);
  }
  pSVar1 = list_elements.super__Vector_base<SingleElements,_std::allocator<SingleElements>_>._M_impl
           .super__Vector_impl_data._M_end_of_storage;
  std::vector<FormatType::TrackItem,_std::allocator<FormatType::TrackItem>_>::~vector
            ((vector<FormatType::TrackItem,_std::allocator<FormatType::TrackItem>_> *)&__range1);
  std::vector<SingleElements,_std::allocator<SingleElements>_>::~vector
            ((vector<SingleElements,_std::allocator<SingleElements>_> *)
             &list_item.
              super__Vector_base<FormatType::TrackItem,_std::allocator<FormatType::TrackItem>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  return (IDisk *)pSVar1;
}

Assistant:

IDisk* Disk::CreateDisk(ILoadingProgress* loading_progress, ILog* log)
{
   IDisk* disk = nullptr;

   std::vector<SingleElements> list_elements = contained_element_->GetInnerElements(3);
   std::vector<FormatType::TrackItem> list_item;
   for (auto& list_element : list_elements)
   {
      FormatType::TrackItem item;
      item.buffer = list_element.buffer_;
      item.size = list_element.size_;
      item.path = list_element.filename_;
      list_item.push_back(item);
   }


   if (disk_builder_.LoadDisk(list_item, disk, loading_progress) == 0)
   {
      disk->SetName(list_elements[0].filename_);
   }
   return disk;
}